

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O2

void __thiscall
ElementsAddressFactory_GetAddressByHash160_Test::TestBody
          (ElementsAddressFactory_GetAddressByHash160_Test *this)

{
  bool bVar1;
  char *pcVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_380;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ElementsAddressFactory factory;
  Address address;
  Address local_190;
  
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (&factory,kElementsRegtest,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &address);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &address);
  std::__cxx11::string::string
            ((string *)&gtest_ar_1,"c4d571179a455b8976b79cf99183fd2bbafe6bfd",(allocator *)&gtest_ar
            );
  cfd::core::ByteData160::ByteData160((ByteData160 *)&local_380,(string *)&gtest_ar_1);
  cfd::AddressFactory::GetAddressByHash
            (&address,&factory.super_AddressFactory,kP2pkhAddress,(ByteData160 *)&local_380);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_380);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_380,
             &address.hash_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&local_380);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"address.GetHash().GetHex().c_str()",
             "\"c4d571179a455b8976b79cf99183fd2bbafe6bfd\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_380);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_380,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_380);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_380._M_impl.super__Vector_impl_data._M_start._0_4_ = address.addr_type_;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&local_380,(AddressType *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_380);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_380);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::ByteData160::ByteData160((ByteData160 *)&gtest_ar_1);
    cfd::AddressFactory::GetAddressByHash
              (&local_190,&factory.super_AddressFactory,kP2wpkhAddress,(ByteData160 *)&gtest_ar_1);
    cfd::core::Address::~Address(&local_190);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
  }
  testing::Message::Message((Message *)&gtest_ar_1);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_380,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x9d,
             "Expected: factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData160()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_380,(Message *)&gtest_ar_1);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_380);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1);
  cfd::core::Address::~Address(&address);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  return;
}

Assistant:

TEST(ElementsAddressFactory, GetAddressByHash160)
{
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList());
    Address address = factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData160("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);

    EXPECT_THROW(factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData160()), CfdException);
  }
}